

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall pbrt::DistantLight::Phi(DistantLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [56];
  SampledSpectrum SVar11;
  undefined1 auVar6 [64];
  undefined1 auVar8 [56];
  undefined1 auVar9 [64];
  
  auVar10 = in_ZMM1._8_56_;
  fVar1 = this->scale;
  auVar4._4_4_ = fVar1;
  auVar4._0_4_ = fVar1;
  auVar4._8_4_ = fVar1;
  auVar4._12_4_ = fVar1;
  auVar8 = ZEXT856(auVar4._8_8_);
  SVar11 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  auVar2 = vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  auVar5._0_4_ = auVar2._0_4_ * fVar1;
  auVar5._4_4_ = auVar2._4_4_ * fVar1;
  auVar5._8_4_ = auVar2._8_4_ * fVar1;
  auVar5._12_4_ = auVar2._12_4_ * fVar1;
  fVar1 = this->sceneRadius;
  auVar2._8_4_ = 0x40490fdb;
  auVar2._0_8_ = 0x40490fdb40490fdb;
  auVar2._12_4_ = 0x40490fdb;
  auVar2 = vmulps_avx512vl(auVar5,auVar2);
  fVar3 = fVar1 * fVar1 * auVar2._0_4_;
  fVar7 = fVar1 * fVar1 * auVar2._4_4_;
  auVar2 = CONCAT412(fVar1 * fVar1 * auVar2._12_4_,
                     CONCAT48(fVar1 * fVar1 * auVar2._8_4_,CONCAT44(fVar7,fVar3)));
  auVar2 = vshufpd_avx(auVar2,auVar2,1);
  SVar11.values.values._8_8_ = auVar2._0_8_;
  SVar11.values.values[0] = fVar3;
  SVar11.values.values[1] = fVar7;
  return (SampledSpectrum)SVar11.values.values;
}

Assistant:

SampledSpectrum DistantLight::Phi(const SampledWavelengths &lambda) const {
    return scale * Lemit.Sample(lambda) * Pi * sceneRadius * sceneRadius;
}